

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O0

void Pla_ManHashCubes(Pla_Man_t *p,Tab_Man_t *pTab)

{
  int iVar1;
  Vec_Int_t *vCube_00;
  int local_24;
  int Value;
  int i;
  Vec_Int_t *vCube;
  Tab_Man_t *pTab_local;
  Pla_Man_t *p_local;
  
  Vec_IntClear(&p->vHashes);
  iVar1 = Pla_ManCubeNum(p);
  Vec_IntGrow(&p->vHashes,iVar1);
  for (local_24 = 0; iVar1 = Vec_WecSize(&p->vCubeLits), local_24 < iVar1; local_24 = local_24 + 1)
  {
    vCube_00 = Vec_WecEntry(&p->vCubeLits,local_24);
    iVar1 = Pla_CubeHashValue(vCube_00);
    Vec_IntPush(&p->vHashes,iVar1);
    Tab_ManHashInsert(pTab,iVar1,local_24,0xffff);
  }
  return;
}

Assistant:

void Pla_ManHashCubes( Pla_Man_t * p, Tab_Man_t * pTab )
{
    Vec_Int_t * vCube; int i, Value;
    Vec_IntClear( &p->vHashes );
    Vec_IntGrow( &p->vHashes, Pla_ManCubeNum(p) );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
    {
        Value = Pla_CubeHashValue(vCube);
        Vec_IntPush( &p->vHashes, Value );
        Tab_ManHashInsert( pTab, Value, i, PLA_LIT_UNUSED );
    }
}